

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Type,_8UL>::push_back
          (ArrayWithPreallocation<soul::Type,_8UL> *this,Type *item)

{
  Type *pTVar1;
  Type *pTVar2;
  size_t sVar3;
  Structure *pSVar4;
  Category CVar5;
  bool bVar6;
  bool bVar7;
  BoundedIntSize BVar8;
  
  reserve(this,this->numActive + 1);
  pTVar2 = this->items;
  sVar3 = this->numActive;
  CVar5 = item->arrayElementCategory;
  bVar6 = item->isRef;
  bVar7 = item->isConstant;
  pTVar1 = pTVar2 + sVar3;
  pTVar1->category = item->category;
  pTVar1->arrayElementCategory = CVar5;
  pTVar1->isRef = bVar6;
  pTVar1->isConstant = bVar7;
  pTVar2[sVar3].primitiveType.type = (item->primitiveType).type;
  BVar8 = item->arrayElementBoundingSize;
  pTVar2[sVar3].boundingSize = item->boundingSize;
  pTVar2[sVar3].arrayElementBoundingSize = BVar8;
  pSVar4 = (item->structure).object;
  pTVar2[sVar3].structure.object = pSVar4;
  if (pSVar4 != (Structure *)0x0) {
    (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
  }
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (const Item& item)                       { reserve (numActive + 1); new (items + numActive) Item (item); ++numActive; }